

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

bool __thiscall
SQCompilation::NodeEqualChecker::cmpGetSlot(NodeEqualChecker *this,GetSlotExpr *l,GetSlotExpr *r)

{
  bool bVar1;
  
  if ((l->super_SlotAccessExpr).super_AccessExpr._nullable ==
      (r->super_SlotAccessExpr).super_AccessExpr._nullable) {
    bVar1 = check(this,&((l->super_SlotAccessExpr)._key)->super_Node,
                  &((r->super_SlotAccessExpr)._key)->super_Node);
    if (bVar1) {
      bVar1 = check(this,&((l->super_SlotAccessExpr).super_AccessExpr._receiver)->super_Node,
                    &((r->super_SlotAccessExpr).super_AccessExpr._receiver)->super_Node);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool cmpTerminate(const TerminateStatement *l, const TerminateStatement *r) const {
    return check(l->argument(), r->argument());
  }